

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcAnnotation::IfcAnnotation(IfcAnnotation *this)

{
  IfcAnnotation *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcProduct).field_0x110,"IfcAnnotation");
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__010c6d30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotation,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotation,_0UL> *)
             &(this->super_IfcProduct).field_0x100,&PTR_construction_vtable_24__010c6de0);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x10c6c50;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x10c6d18;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x10c6c78;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x10c6ca0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x10c6cc8;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x10c6cf0;
  return;
}

Assistant:

IfcAnnotation() : Object("IfcAnnotation") {}